

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::FillerParameter::FillerParameter(FillerParameter *this,FillerParameter *from)

{
  void *pvVar1;
  string *initial_value;
  int32 iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FillerParameter_006f8490;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->type_).ptr_ = (string *)&_default_type__abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 1) != 0) &&
     (initial_value = (from->type_).ptr_, initial_value != (string *)&_default_type__abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->type_,initial_value);
  }
  fVar5 = from->value_;
  fVar6 = from->min_;
  fVar7 = from->mean_;
  iVar8 = from->variance_norm_;
  iVar2 = from->sparse_;
  fVar3 = from->max_;
  fVar4 = from->std_;
  this->variance_norm_ = from->variance_norm_;
  this->sparse_ = iVar2;
  this->max_ = fVar3;
  this->std_ = fVar4;
  this->value_ = fVar5;
  this->min_ = fVar6;
  this->mean_ = fVar7;
  this->variance_norm_ = iVar8;
  return;
}

Assistant:

FillerParameter::FillerParameter(const FillerParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  type_.UnsafeSetDefault(&FillerParameter::_default_type_.get());
  if (from.has_type()) {
    type_.AssignWithDefault(&FillerParameter::_default_type_.get(), from.type_);
  }
  ::memcpy(&value_, &from.value_,
    reinterpret_cast<char*>(&std_) -
    reinterpret_cast<char*>(&value_) + sizeof(std_));
  // @@protoc_insertion_point(copy_constructor:caffe.FillerParameter)
}